

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

gguf_type gguf_get_kv_type(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  gguf_type gVar2;
  long in_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (-1 < key_id) {
    pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    in_RAX = (long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pgVar1 >> 3;
    if (in_RAX * 0x2e8ba2e8ba2e8ba3 - key_id != 0 && key_id <= in_RAX * 0x2e8ba2e8ba2e8ba3) {
      gVar2 = GGUF_TYPE_ARRAY;
      if (pgVar1[key_id].is_array == false) {
        gVar2 = pgVar1[key_id].type;
      }
      return gVar2;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,0x300,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)",in_R8,
             in_R9,in_RAX);
}

Assistant:

enum gguf_type gguf_get_kv_type(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    return ctx->kv[key_id].is_array ? GGUF_TYPE_ARRAY : ctx->kv[key_id].get_type();
}